

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O3

void * __thiscall tcmalloc::ThreadCache::Alloc(ThreadCache *this,size_t size,uint64_t cl)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  uint64_t uVar4;
  ThreadCacheFreeList *fl;
  
  if (cl - 1 < 0x55) {
    fl = this->freelists_ + cl;
    uVar4 = (fl->list_).free_count_;
    if (uVar4 == 0) {
      FetchFromCentralCache(this,fl);
      uVar4 = (fl->list_).free_count_;
    }
    puVar1 = (undefined8 *)this->freelists_[cl].list_.head_;
    this->freelists_[cl].list_.head_ = (void *)*puVar1;
    (fl->list_).free_count_ = uVar4 - 1;
    uVar3 = (uint)(uVar4 - 1);
    if (uVar3 < this->freelists_[cl].lowater_) {
      this->freelists_[cl].lowater_ = uVar3;
    }
    lVar2 = (&SizeClasses)[cl * 3];
    this->size_ = this->size_ - lVar2;
    this->total_alloc_ = this->total_alloc_ + lVar2;
    return puVar1;
  }
  __assert_fail("0 < cl && cl < kMaxClass",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/thread_cache.hpp"
                ,0x25,"void *tcmalloc::ThreadCache::Alloc(size_t, uint64_t)");
}

Assistant:

void* Alloc(size_t size, uint64_t cl) {
        assert(0 < cl && cl < kMaxClass);
        void* rv;
        if (!freelists_[cl].TryPop(&rv)) {
            FetchFromCentralCache(freelists_[cl]);
            freelists_[cl].TryPop(&rv);
        }
        size = ClassSize(cl);
        size_ -= size;
        total_alloc_ += size;
        return rv;
    }